

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.hxx
# Opt level: O1

void __thiscall
nuraft::srv_config::srv_config
          (srv_config *this,int32 id,int32 dc_id,string *endpoint,string *aux,bool learner,
          int32 priority)

{
  pointer pcVar1;
  
  this->id_ = id;
  this->dc_id_ = dc_id;
  (this->endpoint_)._M_dataplus._M_p = (pointer)&(this->endpoint_).field_2;
  pcVar1 = (endpoint->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->endpoint_,pcVar1,pcVar1 + endpoint->_M_string_length);
  (this->aux_)._M_dataplus._M_p = (pointer)&(this->aux_).field_2;
  pcVar1 = (aux->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->aux_,pcVar1,pcVar1 + aux->_M_string_length);
  this->learner_ = learner;
  this->priority_ = priority;
  return;
}

Assistant:

srv_config(int32 id,
               int32 dc_id,
               const std::string& endpoint,
               const std::string& aux,
               bool learner,
               int32 priority = INIT_PRIORITY)
        : id_(id)
        , dc_id_(dc_id)
        , endpoint_(endpoint)
        , aux_(aux)
        , learner_(learner)
        , priority_(priority)
        {}